

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionForDecPOMDP.cpp
# Opt level: O0

string * __thiscall QFunctionForDecPOMDP::GetCacheFilename_abi_cxx11_(QFunctionForDecPOMDP *this)

{
  ostream *poVar1;
  PlanningUnit *this_00;
  size_t sVar2;
  long *in_RSI;
  string *in_RDI;
  double dVar3;
  stringstream ss;
  allocator<char> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  PlanningUnit *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  string local_210 [55];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  (**(code **)(*in_RSI + 0x60))();
  directories::MADPGetResultsDir(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  poVar1 = std::operator<<(local_188,local_1b8);
  poVar1 = std::operator<<(poVar1,"/");
  (**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0x60)) + 0x48))
            (local_210,(long)in_RSI + *(long *)(*in_RSI + -0x60));
  poVar1 = std::operator<<(poVar1,local_210);
  poVar1 = std::operator<<(poVar1,"heuristic_h");
  this_00 = (PlanningUnit *)(**(code **)(*in_RSI + 0x60))();
  sVar2 = PlanningUnit::GetHorizon(this_00);
  std::ostream::operator<<(poVar1,sVar2);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  (**(code **)(*in_RSI + 0x60))();
  dVar3 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8a0c81);
  if ((dVar3 != 1.0) || (NAN(dVar3))) {
    poVar1 = std::operator<<(local_188,"_g");
    (**(code **)(*in_RSI + 0x60))();
    dVar3 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8a0cde);
    std::ostream::operator<<(poVar1,dVar3);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string QFunctionForDecPOMDP::GetCacheFilename() const
{
    stringstream ss;
    ss << directories::MADPGetResultsDir("GMAA",GetPU())
       << "/" << SoftPrintBrief() << "heuristic_h" << GetPU()->GetHorizon();
    if(GetPU()->GetDiscount()!=1)
        ss << "_g" << GetPU()->GetDiscount();
    return(ss.str());
}